

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastcgi_api.cpp
# Opt level: O0

void __thiscall cppcms::impl::cgi::fastcgi::async_read_headers(fastcgi *this,handler *h)

{
  fastcgi *in_RSI;
  callback<void_(const_std::error_code_&)> *in_RDI;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *in_stack_ffffffffffffff98;
  fastcgi *in_stack_ffffffffffffffb8;
  offset_in_fastcgi_to_subr in_stack_ffffffffffffffd0;
  handler *in_stack_ffffffffffffffe8;
  
  (**(code **)&(in_RDI->call_ptr).p_[6].super_refcounted.refs_)();
  connection::reset_all((connection *)0x48af4b);
  self(in_stack_ffffffffffffffb8);
  mfunc_to_event_handler<cppcms::impl::cgi::fastcgi,std::shared_ptr<cppcms::impl::cgi::fastcgi>,booster::callback<void(std::error_code_const&)>const&,booster::callback<void(std::error_code_const&)>>
            (in_stack_ffffffffffffffd0,(shared_ptr<cppcms::impl::cgi::fastcgi> *)0x0,
             (callback<void_(const_std::error_code_&)> *)on_start_request);
  booster::callback<void(std::error_code_const&)>::
  callback<booster::callable<void(std::error_code_const&)>>(in_RDI,in_stack_ffffffffffffff98);
  async_read_record(in_RSI,in_stack_ffffffffffffffe8);
  booster::callback<void_(const_std::error_code_&)>::~callback
            ((callback<void_(const_std::error_code_&)> *)0x48afc0);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
            (&in_RDI->call_ptr);
  std::shared_ptr<cppcms::impl::cgi::fastcgi>::~shared_ptr
            ((shared_ptr<cppcms::impl::cgi::fastcgi> *)0x48afd4);
  return;
}

Assistant:

virtual void async_read_headers(handler const &h)
		{
			reset_all();
            connection::reset_all();
			async_read_record(mfunc_to_event_handler(&fastcgi::on_start_request,self(),h));
		}